

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool bitset_container_iterate64
                (bitset_container_t *cont,uint32_t base,roaring_iterator64 iterator,
                uint64_t high_bits,void *ptr)

{
  long lVar1;
  _Bool _Var2;
  ulong uVar3;
  uint64_t uVar4;
  _Bool _Var5;
  
  uVar3 = 0;
  _Var5 = false;
  do {
    uVar4 = cont->words[uVar3];
    while (uVar4 != 0) {
      lVar1 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      _Var2 = (*iterator)((int)lVar1 + base | high_bits,ptr);
      uVar4 = uVar4 & uVar4 - 1;
      if (!_Var2) {
        return _Var5;
      }
    }
    base = base + 0x40;
    _Var5 = 0x3fe < uVar3;
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x400) {
      return true;
    }
  } while( true );
}

Assistant:

bool bitset_container_iterate64(const bitset_container_t *cont, uint32_t base, roaring_iterator64 iterator, uint64_t high_bits, void *ptr) {
  for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
    uint64_t w = cont->words[i];
    while (w != 0) {
      uint64_t t = w & (~w + 1);
      int r = __builtin_ctzll(w);
      if(!iterator(high_bits | (uint64_t)(r + base), ptr)) return false;
      w ^= t;
    }
    base += 64;
  }
  return true;
}